

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QTextLayout::FormatRange>::insert
          (QMovableArrayOps<QTextLayout::FormatRange> *this,qsizetype i,qsizetype n,parameter_type t
          )

{
  qsizetype *pqVar1;
  FormatRange *pFVar2;
  long in_FS_OFFSET;
  bool bVar3;
  Inserter local_78;
  undefined8 local_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_50._0_4_ = t->start;
  local_50._4_4_ = t->length;
  QTextFormat::QTextFormat((QTextFormat *)&local_48,&(t->format).super_QTextFormat);
  bVar3 = (this->super_QGenericArrayOps<QTextLayout::FormatRange>).
          super_QArrayDataPointer<QTextLayout::FormatRange>.size != 0;
  QArrayDataPointer<QTextLayout::FormatRange>::detachAndGrow
            ((QArrayDataPointer<QTextLayout::FormatRange> *)this,(uint)(i == 0 && bVar3),n,
             (FormatRange **)0x0,(QArrayDataPointer<QTextLayout::FormatRange> *)0x0);
  if (i == 0 && bVar3) {
    if (n != 0) {
      pFVar2 = (this->super_QGenericArrayOps<QTextLayout::FormatRange>).
               super_QArrayDataPointer<QTextLayout::FormatRange>.ptr;
      do {
        pFVar2[-1].start = (undefined4)local_50;
        pFVar2[-1].length = local_50._4_4_;
        QTextFormat::QTextFormat(&pFVar2[-1].format.super_QTextFormat,(QTextFormat *)&local_48);
        pFVar2 = (this->super_QGenericArrayOps<QTextLayout::FormatRange>).
                 super_QArrayDataPointer<QTextLayout::FormatRange>.ptr;
        pqVar1 = &(this->super_QGenericArrayOps<QTextLayout::FormatRange>).
                  super_QArrayDataPointer<QTextLayout::FormatRange>.size;
        *pqVar1 = *pqVar1 + 1;
        pFVar2 = pFVar2 + -1;
        (this->super_QGenericArrayOps<QTextLayout::FormatRange>).
        super_QArrayDataPointer<QTextLayout::FormatRange>.ptr = pFVar2;
        n = n + -1;
      } while (n != 0);
    }
  }
  else {
    pFVar2 = (this->super_QGenericArrayOps<QTextLayout::FormatRange>).
             super_QArrayDataPointer<QTextLayout::FormatRange>.ptr + i;
    local_78.displaceTo = pFVar2 + n;
    local_78.bytes =
         ((this->super_QGenericArrayOps<QTextLayout::FormatRange>).
          super_QArrayDataPointer<QTextLayout::FormatRange>.size - i) * 0x18;
    local_78.data = (QArrayDataPointer<QTextLayout::FormatRange> *)this;
    local_78.displaceFrom = pFVar2;
    local_78.nInserts = n;
    memmove(local_78.displaceTo,pFVar2,local_78.bytes);
    if (n != 0) {
      do {
        pFVar2->start = (undefined4)local_50;
        pFVar2->length = local_50._4_4_;
        QTextFormat::QTextFormat(&(pFVar2->format).super_QTextFormat,(QTextFormat *)&local_48);
        pFVar2 = local_78.displaceFrom + 1;
        n = n + -1;
        local_78.displaceFrom = pFVar2;
      } while (n != 0);
    }
    Inserter::~Inserter(&local_78);
  }
  QTextFormat::~QTextFormat((QTextFormat *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }